

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_predict.c
# Opt level: O2

int PredictorSetup(TIFF *tif)

{
  uint16_t uVar1;
  uint uVar2;
  uint *puVar3;
  ushort uVar4;
  ulong uVar5;
  long lVar6;
  char *fmt;
  
  puVar3 = (uint *)tif->tif_data;
  uVar2 = *puVar3;
  if (uVar2 == 1) {
    return 1;
  }
  if (uVar2 == 3) {
    if ((tif->tif_dir).td_sampleformat == 3) {
      uVar1 = (tif->tif_dir).td_bitspersample;
      uVar4 = uVar1 * 0x2000 | (ushort)(uVar1 - 0x10) >> 3;
      if ((uVar4 < 7) && ((0x47U >> (uVar4 & 0x1f) & 1) != 0)) goto LAB_0026a649;
      fmt = "Floating point \"Predictor\" not supported with %u-bit samples";
    }
    else {
      fmt = "Floating point \"Predictor\" not supported with %u data format";
    }
  }
  else {
    if (uVar2 != 2) {
      TIFFErrorExtR(tif,"PredictorSetup","\"Predictor\" value %d not supported",(ulong)uVar2);
      return 0;
    }
    uVar1 = (tif->tif_dir).td_bitspersample;
    uVar4 = uVar1 * 0x2000 | (ushort)(uVar1 - 8) >> 3;
    if ((uVar4 < 8) && ((0x8bU >> (uVar4 & 0x1f) & 1) != 0)) {
LAB_0026a649:
      if ((tif->tif_dir).td_planarconfig == 1) {
        uVar5 = (ulong)(tif->tif_dir).td_samplesperpixel;
      }
      else {
        uVar5 = 1;
      }
      *(ulong *)(puVar3 + 2) = uVar5;
      if ((tif->tif_flags & 0x400) == 0) {
        lVar6 = TIFFScanlineSize(tif);
      }
      else {
        lVar6 = TIFFTileRowSize(tif);
      }
      *(long *)(puVar3 + 4) = lVar6;
      return (uint)(lVar6 != 0);
    }
    fmt = "Horizontal differencing \"Predictor\" not supported with %u-bit samples";
  }
  TIFFErrorExtR(tif,"PredictorSetup",fmt);
  return 0;
}

Assistant:

static int PredictorSetup(TIFF *tif)
{
    static const char module[] = "PredictorSetup";

    TIFFPredictorState *sp = PredictorState(tif);
    TIFFDirectory *td = &tif->tif_dir;

    switch (sp->predictor) /* no differencing */
    {
        case PREDICTOR_NONE:
            return 1;
        case PREDICTOR_HORIZONTAL:
            if (td->td_bitspersample != 8 && td->td_bitspersample != 16 &&
                td->td_bitspersample != 32 && td->td_bitspersample != 64)
            {
                TIFFErrorExtR(tif, module,
                              "Horizontal differencing \"Predictor\" not "
                              "supported with %" PRIu16 "-bit samples",
                              td->td_bitspersample);
                return 0;
            }
            break;
        case PREDICTOR_FLOATINGPOINT:
            if (td->td_sampleformat != SAMPLEFORMAT_IEEEFP)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Floating point \"Predictor\" not supported with %" PRIu16
                    " data format",
                    td->td_sampleformat);
                return 0;
            }
            if (td->td_bitspersample != 16 && td->td_bitspersample != 24 &&
                td->td_bitspersample != 32 && td->td_bitspersample != 64)
            { /* Should 64 be allowed? */
                TIFFErrorExtR(
                    tif, module,
                    "Floating point \"Predictor\" not supported with %" PRIu16
                    "-bit samples",
                    td->td_bitspersample);
                return 0;
            }
            break;
        default:
            TIFFErrorExtR(tif, module, "\"Predictor\" value %d not supported",
                          sp->predictor);
            return 0;
    }
    sp->stride =
        (td->td_planarconfig == PLANARCONFIG_CONTIG ? td->td_samplesperpixel
                                                    : 1);
    /*
     * Calculate the scanline/tile-width size in bytes.
     */
    if (isTiled(tif))
        sp->rowsize = TIFFTileRowSize(tif);
    else
        sp->rowsize = TIFFScanlineSize(tif);
    if (sp->rowsize == 0)
        return 0;

    return 1;
}